

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseErrorTest_EnumReservedNegativeNumberOutOfRange_Test
::~ParseErrorTest_EnumReservedNegativeNumberOutOfRange_Test
          (ParseErrorTest_EnumReservedNegativeNumberOutOfRange_Test *this)

{
  ParseErrorTest_EnumReservedNegativeNumberOutOfRange_Test *this_local;
  
  ~ParseErrorTest_EnumReservedNegativeNumberOutOfRange_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseErrorTest, EnumReservedNegativeNumberOutOfRange) {
  ExpectHasErrors(
      "enum TestEnum {\n"
      "FOO = 1;\n"
      "  reserved -2147483649;\n"
      "}\n",
      "2:12: Integer out of range.\n");
}